

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall CConnman::Start(CConnman *this,CScheduler *scheduler,Options *connOptions)

{
  long lVar1;
  CClientUIInterface *pCVar2;
  pointer pbVar3;
  pointer pbVar4;
  Function f;
  Function f_00;
  undefined8 __p;
  mutex_type *pmVar5;
  bool bVar6;
  bool bVar7;
  id iVar8;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  char *fmt;
  unsigned_long *in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  _Manager_type in_stack_fffffffffffffe30;
  _Any_data local_1c0;
  code *local_1b0;
  code *local_1a8;
  thread local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seed_nodes;
  undefined1 local_180 [72];
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock83;
  undefined1 local_128 [16];
  string local_118 [3];
  path local_b0;
  Proxy i2p_sam;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Init(this,connOptions);
  if ((fListen == true) && (bVar6 = InitBinds(this,connOptions), !bVar6)) {
    pCVar2 = this->m_client_interface;
    if (pCVar2 != (CClientUIInterface *)0x0) {
      _((bilingual_str *)&criticalblock83,(ConstevalStringLiteral)0x69cd48);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&i2p_sam,"",(allocator<char> *)local_180);
      CClientUIInterface::ThreadSafeMessageBox
                (pCVar2,(bilingual_str *)&criticalblock83,(string *)&i2p_sam,0x10000402);
      std::__cxx11::string::~string((string *)&i2p_sam);
      bilingual_str::~bilingual_str((bilingual_str *)&criticalblock83);
    }
    bVar6 = false;
    goto LAB_001829de;
  }
  Proxy::Proxy(&i2p_sam);
  bVar6 = GetProxy(NET_I2P,&i2p_sam);
  if ((bVar6) && (connOptions->m_i2p_accept_incoming == true)) {
    ArgsManager::GetDataDirNet((path *)&local_b0,&gArgs);
    fs::operator/((path *)&criticalblock83,(path *)&local_b0,"i2p_private_key");
    seed_nodes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&this->interruptNet;
    std::make_unique<i2p::sam::Session,fs::path,Proxy&,CThreadInterrupt*>
              ((path *)local_180,(Proxy *)&criticalblock83,(CThreadInterrupt **)&i2p_sam);
    __p = local_180._0_8_;
    local_180._0_8_ = 0;
    std::__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::reset
              ((__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
               &this->m_i2p_sam_session,(pointer)__p);
    std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
              ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)local_180);
    std::filesystem::__cxx11::path::~path((path *)&criticalblock83);
    std::filesystem::__cxx11::path::~path(&local_b0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&seed_nodes,&connOptions->vSeedNodes);
  pbVar4 = seed_nodes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = seed_nodes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (seed_nodes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      seed_nodes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FastRandomContext::FastRandomContext((FastRandomContext *)&criticalblock83,false);
    std::
    shuffle<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,FastRandomContext>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )pbVar3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )pbVar4,(FastRandomContext *)&criticalblock83);
    ChaCha20::~ChaCha20((ChaCha20 *)local_128);
  }
  if (this->m_use_addrman_outgoing == true) {
    ArgsManager::GetDataDirNet((path *)(local_180 + 0x20),&gArgs);
    fs::operator/((path *)&criticalblock83,(path *)(local_180 + 0x20),"anchors.dat");
    ReadAnchors((vector<CAddress,_std::allocator<CAddress>_> *)local_180,(path *)&criticalblock83);
    std::vector<CAddress,_std::allocator<CAddress>_>::_M_move_assign
              (&this->m_anchors,(vector<CAddress,_std::allocator<CAddress>_> *)local_180);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)local_180);
    std::filesystem::__cxx11::path::~path((path *)&criticalblock83);
    std::filesystem::__cxx11::path::~path((path *)(local_180 + 0x20));
    fmt = (char *)0x38;
    criticalblock83.super_unique_lock._M_device =
         (mutex_type *)
         (((long)(this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x38);
    if ((mutex_type *)0x2 < criticalblock83.super_unique_lock._M_device) {
      fmt = (char *)0x182317;
      std::vector<CAddress,_std::allocator<CAddress>_>::resize(&this->m_anchors,2);
      criticalblock83.super_unique_lock._M_device =
           (mutex_type *)
           (((long)(this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl
                   .super__Vector_impl_data._M_finish -
            (long)(this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x38);
    }
    logging_function._M_str = "Start";
    logging_function._M_len = 5;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
    source_file._M_len = 0x50;
    LogPrintf_<unsigned_long>
              (logging_function,source_file,0xcd9,
               I2P|VALIDATION|QT|MEMPOOLREJ|PROXY|PRUNE|REINDEX|SELECTCOINS|ESTIMATEFEE|RPC|BENCH|
               HTTP|MEMPOOL,(Level)(path *)&criticalblock83,fmt,in_stack_fffffffffffffe18);
  }
  pCVar2 = this->m_client_interface;
  if (pCVar2 != (CClientUIInterface *)0x0) {
    _((bilingual_str *)&criticalblock83,(ConstevalStringLiteral)0x69cdd8);
    CClientUIInterface::InitMessage(pCVar2,local_118);
    bilingual_str::~bilingual_str((bilingual_str *)&criticalblock83);
  }
  this->fAddressesInitialized = true;
  if ((this->semOutbound)._M_t.super___uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>.
      _M_t.super__Tuple_impl<0UL,_CSemaphore_*,_std::default_delete<CSemaphore>_>.
      super__Head_base<0UL,_CSemaphore_*,_false>._M_head_impl == (CSemaphore *)0x0) {
    std::make_unique<CSemaphore,int_const&>((int *)&criticalblock83);
    pmVar5 = criticalblock83.super_unique_lock._M_device;
    criticalblock83.super_unique_lock._M_device = (mutex_type *)0x0;
    std::__uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>::reset
              ((__uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_> *)&this->semOutbound,
               (pointer)pmVar5);
    std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::~unique_ptr
              ((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)&criticalblock83);
  }
  if ((this->semAddnode)._M_t.super___uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>.
      _M_t.super__Tuple_impl<0UL,_CSemaphore_*,_std::default_delete<CSemaphore>_>.
      super__Head_base<0UL,_CSemaphore_*,_false>._M_head_impl == (CSemaphore *)0x0) {
    std::make_unique<CSemaphore,int&>((int *)&criticalblock83);
    pmVar5 = criticalblock83.super_unique_lock._M_device;
    criticalblock83.super_unique_lock._M_device = (mutex_type *)0x0;
    std::__uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>::reset
              ((__uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_> *)&this->semAddnode,
               (pointer)pmVar5);
    std::unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_>::~unique_ptr
              ((unique_ptr<CSemaphore,_std::default_delete<CSemaphore>_> *)&criticalblock83);
  }
  if (this->m_msgproc == (NetEventsInterface *)0x0) {
    __assert_fail("m_msgproc",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                  ,0xcee,"bool CConnman::Start(CScheduler &, const Options &)");
  }
  CThreadInterrupt::reset(&this->interruptNet);
  LOCK();
  (this->flagInterruptMsgProc)._M_base._M_i = false;
  UNLOCK();
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock83,&this->mutexMsgProc,"mutexMsgProc",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
             0xcf3,false);
  this->fMsgProcWake = false;
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock83.super_unique_lock);
  local_180._0_8_ = 0;
  criticalblock83.super_unique_lock._M_device = (mutex_type *)operator_new(0x20);
  ((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__align =
       (long)&PTR___State_00a20a40;
  *(CConnman **)
   ((long)&((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex + 8) = this;
  *(char **)((long)&((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex +
            0x10) = "net";
  ((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__data.__list.__prev
       = (__pthread_internal_list *)util::TraceThread;
  std::thread::_M_start_thread(local_180,&criticalblock83,0);
  if (criticalblock83.super_unique_lock._M_device != (mutex_type *)0x0) {
    (**(code **)(((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.
                 __align + 8))();
  }
  std::thread::operator=(&this->threadSocketHandler,(thread *)local_180);
  std::thread::~thread((thread *)local_180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&criticalblock83,"-dnsseed",(allocator<char> *)local_180);
  bVar6 = ArgsManager::GetBoolArg(&gArgs,(string *)&criticalblock83,true);
  std::__cxx11::string::~string((string *)&criticalblock83);
  if (bVar6) {
    local_180._0_8_ = 0;
    criticalblock83.super_unique_lock._M_device = (mutex_type *)operator_new(0x20);
    ((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__align =
         (long)&PTR___State_00a20a90;
    *(CConnman **)
     ((long)&((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex + 8) =
         this;
    *(char **)((long)&((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex +
              0x10) = "dnsseed";
    ((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__data.__list.
    __prev = (__pthread_internal_list *)util::TraceThread;
    std::thread::_M_start_thread(local_180,&criticalblock83,0);
    if (criticalblock83.super_unique_lock._M_device != (mutex_type *)0x0) {
      (**(code **)(((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.
                   __align + 8))();
    }
    std::thread::operator=(&this->threadDNSAddressSeed,(thread *)local_180);
    std::thread::~thread((thread *)local_180);
  }
  else {
    logging_function_00._M_str = "Start";
    logging_function_00._M_len = 5;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
    source_file_00._M_len = 0x50;
    ::LogPrintf_<>(logging_function_00,source_file_00,0xcfb,ALL,Info,"DNS seeding disabled\n");
  }
  local_180._0_8_ = 0;
  criticalblock83.super_unique_lock._M_device = (mutex_type *)operator_new(0x20);
  ((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__align =
       (long)&PTR___State_00a20ae0;
  *(CConnman **)
   ((long)&((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex + 8) = this;
  *(char **)((long)&((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex +
            0x10) = "addcon";
  ((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__data.__list.__prev
       = (__pthread_internal_list *)util::TraceThread;
  std::thread::_M_start_thread(local_180,&criticalblock83,0);
  if (criticalblock83.super_unique_lock._M_device != (mutex_type *)0x0) {
    (**(code **)(((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.
                 __align + 8))();
  }
  std::thread::operator=(&this->threadOpenAddedConnections,(thread *)local_180);
  std::thread::~thread((thread *)local_180);
  pbVar3 = (connOptions->m_specified_outgoing).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (connOptions->m_specified_outgoing).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (connOptions->m_use_addrman_outgoing == true) {
    if (pbVar3 == pbVar4) {
LAB_0018270a:
      criticalblock83.super_unique_lock._M_device = (mutex_type *)this;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&criticalblock83.super_unique_lock._M_owns,&connOptions->m_specified_outgoing);
      local_118[0]._M_dataplus._M_p =
           (pointer)seed_nodes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_118[0]._M_string_length =
           (size_type)
           seed_nodes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_118[0].field_2._M_allocated_capacity =
           seed_nodes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      seed_nodes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      seed_nodes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      seed_nodes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a0._M_id._M_thread = (id)0;
      iVar8._M_thread = (native_handle_type)operator_new(0x50);
      *(undefined ***)iVar8._M_thread = &PTR___State_impl_00a20b30;
      Start(CScheduler&,CConnman::Options_const&)::$_5::__5
                ((__5 *)(iVar8._M_thread + 8),
                 (anon_class_56_3_d9b4194d_for__M_head_impl *)&criticalblock83);
      *(char **)(iVar8._M_thread + 0x40) = "opencon";
      *(code **)(iVar8._M_thread + 0x48) = util::TraceThread;
      local_180._0_8_ = iVar8._M_thread;
      std::thread::_M_start_thread(&local_1a0,local_180,0);
      if (local_180._0_8_ != 0) {
        (**(code **)(*(long *)local_180._0_8_ + 8))();
      }
      std::thread::operator=(&this->threadOpenConnections,&local_1a0);
      std::thread::~thread(&local_1a0);
      Start(CScheduler&,CConnman::Options_const&)::$_5::~__5((__5 *)&criticalblock83);
      goto LAB_001827d8;
    }
    pCVar2 = this->m_client_interface;
    if (pCVar2 != (CClientUIInterface *)0x0) {
      _((bilingual_str *)&criticalblock83,(ConstevalStringLiteral)0x69ce4f);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_180,"",(allocator<char> *)&local_1a0);
      CClientUIInterface::ThreadSafeMessageBox
                (pCVar2,(bilingual_str *)&criticalblock83,(string *)local_180,0x10000402);
      std::__cxx11::string::~string((string *)local_180);
      bilingual_str::~bilingual_str((bilingual_str *)&criticalblock83);
    }
    bVar6 = false;
  }
  else {
    if (pbVar3 != pbVar4) goto LAB_0018270a;
LAB_001827d8:
    local_180._0_8_ = 0;
    criticalblock83.super_unique_lock._M_device = (mutex_type *)operator_new(0x20);
    ((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__align =
         (long)&PTR___State_00a20b80;
    *(CConnman **)
     ((long)&((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex + 8) =
         this;
    *(char **)((long)&((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex +
              0x10) = "msghand";
    ((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__data.__list.
    __prev = (__pthread_internal_list *)util::TraceThread;
    std::thread::_M_start_thread(local_180,&criticalblock83,0);
    if (criticalblock83.super_unique_lock._M_device != (mutex_type *)0x0) {
      (**(code **)(((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.
                   __align + 8))();
    }
    std::thread::operator=(&this->threadMessageHandler,(thread *)local_180);
    std::thread::~thread((thread *)local_180);
    if ((this->m_i2p_sam_session)._M_t.
        super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t.
        super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
        super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl != (Session *)0x0) {
      local_180._0_8_ = 0;
      criticalblock83.super_unique_lock._M_device = (mutex_type *)operator_new(0x20);
      ((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__align =
           (long)&PTR___State_00a20bd0;
      *(CConnman **)
       ((long)&((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex + 8) =
           this;
      *(char **)((long)&((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex
                + 0x10) = "i2paccept";
      ((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.__data.__list.
      __prev = (__pthread_internal_list *)util::TraceThread;
      std::thread::_M_start_thread(local_180,&criticalblock83,0);
      if (criticalblock83.super_unique_lock._M_device != (mutex_type *)0x0) {
        (**(code **)(((criticalblock83.super_unique_lock._M_device)->super___mutex_base)._M_mutex.
                     __align + 8))();
      }
      std::thread::operator=(&this->threadI2PAcceptIncoming,(thread *)local_180);
      std::thread::~thread((thread *)local_180);
    }
    local_1c0._8_8_ = 0;
    local_1a8 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp:3353:29)>
                ::_M_invoke;
    local_1b0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp:3353:29)>
                ::_M_manager;
    f.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffe20;
    f.super__Function_base._M_functor._M_unused._M_object = in_stack_fffffffffffffe18;
    f.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffe28;
    f._M_invoker = (_Invoker_type)in_stack_fffffffffffffe30;
    local_1c0._M_unused._M_object = this;
    CScheduler::scheduleEvery(scheduler,f,(milliseconds)&local_1c0);
    std::_Function_base::~_Function_base((_Function_base *)&local_1c0);
    bVar7 = NetGroupManager::UsingASMap(this->m_netgroupman);
    bVar6 = true;
    if (bVar7) {
      ASMapHealthCheck(this);
      f_00.super__Function_base._M_functor._8_8_ = this;
      f_00.super__Function_base._M_functor._M_unused._M_object = in_stack_fffffffffffffe18;
      f_00.super__Function_base._M_manager = (_Manager_type)0x0;
      f_00._M_invoker =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp:3358:33)>
           ::_M_manager;
      CScheduler::scheduleEvery(scheduler,f_00,(milliseconds)&stack0xfffffffffffffe20);
      std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffe20);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&seed_nodes);
  Proxy::~Proxy(&i2p_sam);
LAB_001829de:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::Start(CScheduler& scheduler, const Options& connOptions)
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);
    Init(connOptions);

    if (fListen && !InitBinds(connOptions)) {
        if (m_client_interface) {
            m_client_interface->ThreadSafeMessageBox(
                _("Failed to listen on any port. Use -listen=0 if you want this."),
                "", CClientUIInterface::MSG_ERROR);
        }
        return false;
    }

    Proxy i2p_sam;
    if (GetProxy(NET_I2P, i2p_sam) && connOptions.m_i2p_accept_incoming) {
        m_i2p_sam_session = std::make_unique<i2p::sam::Session>(gArgs.GetDataDirNet() / "i2p_private_key",
                                                                i2p_sam, &interruptNet);
    }

    // Randomize the order in which we may query seednode to potentially prevent connecting to the same one every restart (and signal that we have restarted)
    std::vector<std::string> seed_nodes = connOptions.vSeedNodes;
    if (!seed_nodes.empty()) {
        std::shuffle(seed_nodes.begin(), seed_nodes.end(), FastRandomContext{});
    }

    if (m_use_addrman_outgoing) {
        // Load addresses from anchors.dat
        m_anchors = ReadAnchors(gArgs.GetDataDirNet() / ANCHORS_DATABASE_FILENAME);
        if (m_anchors.size() > MAX_BLOCK_RELAY_ONLY_ANCHORS) {
            m_anchors.resize(MAX_BLOCK_RELAY_ONLY_ANCHORS);
        }
        LogPrintf("%i block-relay-only anchors will be tried for connections.\n", m_anchors.size());
    }

    if (m_client_interface) {
        m_client_interface->InitMessage(_("Starting network threads…").translated);
    }

    fAddressesInitialized = true;

    if (semOutbound == nullptr) {
        // initialize semaphore
        semOutbound = std::make_unique<CSemaphore>(std::min(m_max_automatic_outbound, m_max_automatic_connections));
    }
    if (semAddnode == nullptr) {
        // initialize semaphore
        semAddnode = std::make_unique<CSemaphore>(m_max_addnode);
    }

    //
    // Start threads
    //
    assert(m_msgproc);
    interruptNet.reset();
    flagInterruptMsgProc = false;

    {
        LOCK(mutexMsgProc);
        fMsgProcWake = false;
    }

    // Send and receive from sockets, accept connections
    threadSocketHandler = std::thread(&util::TraceThread, "net", [this] { ThreadSocketHandler(); });

    if (!gArgs.GetBoolArg("-dnsseed", DEFAULT_DNSSEED))
        LogPrintf("DNS seeding disabled\n");
    else
        threadDNSAddressSeed = std::thread(&util::TraceThread, "dnsseed", [this] { ThreadDNSAddressSeed(); });

    // Initiate manual connections
    threadOpenAddedConnections = std::thread(&util::TraceThread, "addcon", [this] { ThreadOpenAddedConnections(); });

    if (connOptions.m_use_addrman_outgoing && !connOptions.m_specified_outgoing.empty()) {
        if (m_client_interface) {
            m_client_interface->ThreadSafeMessageBox(
                _("Cannot provide specific connections and have addrman find outgoing connections at the same time."),
                "", CClientUIInterface::MSG_ERROR);
        }
        return false;
    }
    if (connOptions.m_use_addrman_outgoing || !connOptions.m_specified_outgoing.empty()) {
        threadOpenConnections = std::thread(
            &util::TraceThread, "opencon",
            [this, connect = connOptions.m_specified_outgoing, seed_nodes = std::move(seed_nodes)] { ThreadOpenConnections(connect, seed_nodes); });
    }

    // Process messages
    threadMessageHandler = std::thread(&util::TraceThread, "msghand", [this] { ThreadMessageHandler(); });

    if (m_i2p_sam_session) {
        threadI2PAcceptIncoming =
            std::thread(&util::TraceThread, "i2paccept", [this] { ThreadI2PAcceptIncoming(); });
    }

    // Dump network addresses
    scheduler.scheduleEvery([this] { DumpAddresses(); }, DUMP_PEERS_INTERVAL);

    // Run the ASMap Health check once and then schedule it to run every 24h.
    if (m_netgroupman.UsingASMap()) {
        ASMapHealthCheck();
        scheduler.scheduleEvery([this] { ASMapHealthCheck(); }, ASMAP_HEALTH_CHECK_INTERVAL);
    }

    return true;
}